

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O2

double runnameAndTorsion(xformDatabase *xdb,char *buf,int max)

{
  double dVar1;
  int iVar2;
  biasFunction *pbVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar5 = 0.0;
  if (buf != (char *)0x0 && xdb != (xformDatabase *)0x0) {
    dVar5 = 0.0;
    for (lVar4 = 0; lVar4 < xdb->nlevs; lVar4 = lVar4 + 1) {
      if (0xf < max) {
        iVar2 = sprintf(buf,"%g ",xdb->level[lVar4]->currVal);
        buf = buf + iVar2;
        max = max - iVar2;
      }
      pbVar3 = (biasFunction *)&xdb->level[lVar4]->funcs;
      while (pbVar3 = pbVar3->next, pbVar3 != (biasFunction *)0x0) {
        iVar2 = pbVar3->type;
        if (iVar2 == 2) {
          dVar1 = pbVar3->v;
          dVar6 = pow(xdb->level[lVar4]->currVal - pbVar3->ph,pbVar3->freq);
          dVar5 = dVar5 + dVar6 * dVar1;
        }
        else if (iVar2 == 1) {
          dVar1 = pbVar3->v;
          dVar6 = pbVar3->shift;
          dVar7 = cos((xdb->level[lVar4]->currVal - pbVar3->ph) * pbVar3->freq * 0.017453293);
          dVar5 = dVar5 + (dVar6 - dVar7) * dVar1 * 0.5;
        }
        else if (iVar2 == 0) {
          dVar5 = dVar5 + pbVar3->v;
        }
      }
    }
  }
  return dVar5;
}

Assistant:

double runnameAndTorsion(xformDatabase* xdb, char* buf, int max) {
   char *p = NULL;
   int i = 0, n = 0;
   double bias = 0.0, phi = 0.0;
   biasFunction *f = NULL;

   if (xdb && buf) {
      bias = 0.0;
      p = buf; /*dcr?: (dcr guesses) that p now points to beginning of buf */
      for(i = 0; i < xdb->nlevs; i++) {
	 if (max > 15) { /* add value to the output buffer */
	    n = sprintf(p, "%g ", xdb->level[i]->currVal);
	            /*dcr?: that sprintf wrote n char into buf starting at p*/
	    p += n; 
                    /*dcr?: p now points n nchar further along in buf*/
                    /*note the space after the %g conversion of double currVal*/
                    /*so when next char written they will have a space between*/
	    max -= n; 

            /*dcr?: max tracks available space in buf, now decremented by n */
            /*buf holds the angle values in order of their use*/
            /*it would be nice to reorder those values for output to .map file*/
            /*e.g. so plotting of phi,tau,psi could be as phi,psi,tau ! */
            /*probably this should be done at the output stage anyway*/
            /*autobondrot output is from probe.c/rawEnumerate() where */
            /*angle values are called char *rawname  which seems to == buf */
	 }

	 /* sum up any bias functions */

	 for(f = xdb->level[i]->funcs; f; f = f->next) {
	    if (f->type == CONSTbiasfunc) {
	       bias += f->v;
	    }
	    else if (f->type == POLYbiasfunc) {
	       bias += f->v * pow(xdb->level[i]->currVal - f->ph, f->freq);
	    }
	    else if (f->type == COSbiasfunc) {
	       phi = f->freq * DEG2RAD * (xdb->level[i]->currVal - f->ph);
	       bias += f->v * 0.5 * (f->shift - cos(phi));
	    }
	 }
      }
   }
   return bias;
}